

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

Type * __thiscall wasm::Type::Iterator::operator*(Iterator *this)

{
  ulong uVar1;
  Tuple *pTVar2;
  Type *this_00;
  
  this_00 = (this->super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>).parent;
  uVar1 = this_00->id;
  if ((uVar1 & 1) == 0 || uVar1 < 7) {
    if ((uVar1 == 0) ||
       ((this->super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>).index != 0)) {
      __assert_fail("index == 0 && *parent != Type::none && \"Index out of bounds\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                    ,0x35f,"const Type &wasm::Type::Iterator::operator*() const");
    }
  }
  else {
    pTVar2 = getTuple(this_00);
    this_00 = (pTVar2->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
              super__Vector_impl_data._M_start +
              (this->super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>).index;
  }
  return this_00;
}

Assistant:

const Type& Type::Iterator::operator*() const {
  if (parent->isTuple()) {
    return parent->getTuple()[index];
  } else {
    assert(index == 0 && *parent != Type::none && "Index out of bounds");
    return *parent;
  }
}